

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O2

void __thiscall
FastPForLib::Simple9<true,_false>::encodeArray
          (Simple9<true,_false> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  runtime_error *this_00;
  uint uVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t *puVar10;
  long lStack_50;
  
  *out = (uint32_t)length;
  puVar10 = out;
  for (; puVar10 = puVar10 + 1, 0x1b < length; length = length + lStack_50) {
    bVar1 = Simple9<true,false>::trymefull<28u,1u>(in);
    if (bVar1) {
      *puVar10 = 0;
      uVar4 = 0;
      for (lVar2 = 0; (int)lVar2 != 0x70; lVar2 = lVar2 + 4) {
        uVar4 = uVar4 * 2 | *(uint *)((long)in + lVar2);
        *puVar10 = uVar4;
      }
      in = (uint32_t *)((long)in + lVar2);
      lStack_50 = -0x1c;
    }
    else {
      bVar1 = Simple9<true,false>::trymefull<14u,2u>(in);
      if (bVar1) {
        *puVar10 = 1;
        uVar4 = 1;
        for (lVar2 = 0; (int)lVar2 != 0x38; lVar2 = lVar2 + 4) {
          uVar4 = uVar4 << 2 | *(uint *)((long)in + lVar2);
          *puVar10 = uVar4;
        }
        in = (uint32_t *)((long)in + lVar2);
        lStack_50 = -0xe;
      }
      else {
        bVar1 = Simple9<true,false>::trymefull<9u,3u>(in);
        if (bVar1) {
          *puVar10 = 2;
          uVar4 = 2;
          for (lVar2 = 0; (int)lVar2 != 0x24; lVar2 = lVar2 + 4) {
            uVar4 = uVar4 << 3 | *(uint *)((long)in + lVar2);
            *puVar10 = uVar4;
          }
          uVar4 = uVar4 * 2;
          in = (uint32_t *)((long)in + lVar2);
          lStack_50 = -9;
        }
        else {
          bVar1 = Simple9<true,false>::trymefull<7u,4u>(in);
          if (bVar1) {
            *puVar10 = 3;
            uVar4 = 3;
            for (lVar2 = 0; (int)lVar2 != 0x1c; lVar2 = lVar2 + 4) {
              uVar4 = uVar4 << 4 | *(uint *)((long)in + lVar2);
              *puVar10 = uVar4;
            }
            in = (uint32_t *)((long)in + lVar2);
            lStack_50 = -7;
            goto LAB_00127432;
          }
          bVar1 = Simple9<true,false>::trymefull<5u,5u>(in);
          if (bVar1) {
            *puVar10 = 4;
            uVar4 = 4;
            for (lVar2 = 0; (int)lVar2 != 0x14; lVar2 = lVar2 + 4) {
              uVar4 = uVar4 << 5 | *(uint *)((long)in + lVar2);
              *puVar10 = uVar4;
            }
            uVar4 = uVar4 << 3;
            in = (uint32_t *)((long)in + lVar2);
            lStack_50 = -5;
          }
          else {
            bVar1 = Simple9<true,false>::trymefull<4u,7u>(in);
            if (bVar1) {
              *puVar10 = 5;
              uVar4 = 5;
              for (lVar2 = 0; (int)lVar2 != 0x10; lVar2 = lVar2 + 4) {
                uVar4 = uVar4 << 7 | *(uint *)((long)in + lVar2);
                *puVar10 = uVar4;
              }
              in = (uint32_t *)((long)in + lVar2);
              lStack_50 = -4;
              goto LAB_00127432;
            }
            bVar1 = Simple9<true,false>::trymefull<3u,9u>(in);
            if (bVar1) {
              *puVar10 = 6;
              uVar4 = 6;
              for (lVar2 = 0; (int)lVar2 != 0xc; lVar2 = lVar2 + 4) {
                uVar4 = uVar4 << 9 | *(uint *)((long)in + lVar2);
                *puVar10 = uVar4;
              }
              uVar4 = uVar4 * 2;
              in = (uint32_t *)((long)in + lVar2);
              lStack_50 = -3;
            }
            else {
              if (*in < 0x4000) {
                if (in[1] < 0x4000) {
                  *puVar10 = 7;
                  uVar4 = 7;
                  for (lVar2 = 0; (int)lVar2 != 8; lVar2 = lVar2 + 4) {
                    uVar4 = uVar4 << 0xe | *(uint *)((long)in + lVar2);
                    *puVar10 = uVar4;
                  }
                  in = (uint32_t *)((long)in + lVar2);
                  lStack_50 = -2;
                  goto LAB_00127432;
                }
              }
              else if (0xfffffff < *in) {
                fprintf(_stderr,"Input\'s out of range: %u\n");
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error
                          (this_00,"You tried to apply Simple9 to an incompatible set of integers.")
                ;
                goto LAB_0012783d;
              }
              *puVar10 = 8;
              uVar4 = *in;
              in = in + 1;
              uVar4 = uVar4 | 0x80000000;
              lStack_50 = -1;
            }
          }
        }
        *puVar10 = uVar4;
      }
    }
LAB_00127432:
  }
  do {
    if (length == 0) {
      *nvalue = (long)puVar10 - (long)out >> 2;
      return;
    }
    bVar1 = Simple9<true,false>::tryme<28u,1u>(in,length);
    if (bVar1) {
      *puVar10 = 0;
      uVar3 = 0x1c;
      if (length < 0x1c) {
        uVar3 = length;
      }
      uVar4 = (uint)uVar3;
      uVar5 = 0;
      uVar9 = uVar3 & 0xffffffff;
      while (iVar7 = (int)uVar9, uVar9 = (ulong)(iVar7 - 1), iVar7 != 0) {
        uVar5 = uVar5 * 2 | *in;
        in = in + 1;
        *puVar10 = uVar5;
      }
      cVar6 = -(char)uVar3;
LAB_00127645:
      uVar5 = uVar5 << ((byte)(cVar6 + 0x1c) & 0x1f);
    }
    else {
      bVar1 = Simple9<true,false>::tryme<14u,2u>(in,length);
      uVar4 = 1;
      if (!bVar1) {
        bVar1 = Simple9<true,false>::tryme<9u,3u>(in,length);
        if (bVar1) {
          *puVar10 = 2;
          uVar3 = 9;
          if (length < 9) {
            uVar3 = length;
          }
          uVar4 = (uint)uVar3;
          uVar9 = uVar3 & 0xffffffff;
          uVar5 = 2;
          while (iVar7 = (int)uVar9, uVar9 = (ulong)(iVar7 - 1), iVar7 != 0) {
            uVar5 = uVar5 << 3 | *in;
            in = in + 1;
            *puVar10 = uVar5;
          }
          cVar6 = (char)uVar3 * -3;
        }
        else {
          bVar1 = Simple9<true,false>::tryme<7u,4u>(in,length);
          if (bVar1) {
            *puVar10 = 3;
            uVar3 = 7;
            if (length < 7) {
              uVar3 = length;
            }
            uVar4 = (uint)uVar3;
            uVar9 = uVar3 & 0xffffffff;
            uVar5 = 3;
            while (iVar7 = (int)uVar9, uVar9 = (ulong)(iVar7 - 1), iVar7 != 0) {
              uVar5 = uVar5 << 4 | *in;
              in = in + 1;
              *puVar10 = uVar5;
            }
            cVar6 = (char)uVar3 * '\x04';
            goto LAB_001275f5;
          }
          bVar1 = Simple9<true,false>::tryme<5u,5u>(in,length);
          if (bVar1) {
            *puVar10 = 4;
            uVar3 = 5;
            if (length < 5) {
              uVar3 = length;
            }
            uVar4 = (uint)uVar3;
            uVar9 = uVar3 & 0xffffffff;
            uVar5 = 4;
            while (iVar7 = (int)uVar9, uVar9 = (ulong)(iVar7 - 1), iVar7 != 0) {
              uVar5 = uVar5 << 5 | *in;
              in = in + 1;
              *puVar10 = uVar5;
            }
            cVar6 = (char)uVar3 * -5;
          }
          else {
            bVar1 = Simple9<true,false>::tryme<4u,7u>(in,length);
            if (bVar1) {
              *puVar10 = 5;
              uVar3 = 4;
              if (length < 4) {
                uVar3 = length;
              }
              uVar4 = (uint)uVar3;
              uVar9 = uVar3 & 0xffffffff;
              uVar5 = 5;
              while (iVar7 = (int)uVar9, uVar9 = (ulong)(iVar7 - 1), iVar7 != 0) {
                uVar5 = uVar5 << 7 | *in;
                in = in + 1;
                *puVar10 = uVar5;
              }
              cVar6 = (char)uVar3 * -7;
            }
            else {
              bVar1 = Simple9<true,false>::tryme<3u,9u>(in,length);
              if (bVar1) {
                *puVar10 = 6;
                uVar3 = 3;
                if (length < 3) {
                  uVar3 = length;
                }
                uVar4 = (uint)uVar3;
                uVar9 = uVar3 & 0xffffffff;
                uVar5 = 6;
                while (iVar7 = (int)uVar9, uVar9 = (ulong)(iVar7 - 1), iVar7 != 0) {
                  uVar5 = uVar5 << 9 | *in;
                  in = in + 1;
                  *puVar10 = uVar5;
                }
                cVar6 = (char)uVar3 * -9;
              }
              else {
                bVar1 = Simple9<true,false>::tryme<2u,14u>(in,length);
                if (!bVar1) {
                  if (0xfffffff < *in) {
                    fprintf(_stderr,"Input\'s out of range: %u\n");
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error
                              (this_00,
                               "You tried to apply Simple9 to an incompatible set of integers.");
LAB_0012783d:
                    __cxa_throw(this_00,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  *puVar10 = 8;
                  uVar5 = *in;
                  in = in + 1;
                  uVar5 = uVar5 | 0x80000000;
                  goto LAB_0012764a;
                }
                *puVar10 = 7;
                uVar4 = (length != 1) + 1;
                uVar5 = 7;
                uVar8 = uVar4;
                while (bVar1 = uVar8 != 0, uVar8 = uVar8 - 1, bVar1) {
                  uVar5 = uVar5 << 0xe | *in;
                  in = in + 1;
                  *puVar10 = uVar5;
                }
                cVar6 = (char)(-0xe << (length != 1));
              }
            }
          }
        }
        goto LAB_00127645;
      }
      *puVar10 = 1;
      uVar5 = 1;
      uVar3 = 0xe;
      if (length < 0xe) {
        uVar3 = length;
      }
      uVar4 = (uint)uVar3;
      uVar9 = uVar3 & 0xffffffff;
      while (iVar7 = (int)uVar9, uVar9 = (ulong)(iVar7 - 1), iVar7 != 0) {
        uVar5 = uVar5 << 2 | *in;
        in = in + 1;
        *puVar10 = uVar5;
      }
      cVar6 = (char)uVar3 * '\x02';
LAB_001275f5:
      uVar5 = uVar5 << ((byte)(0x1c - cVar6) & 0x1f);
    }
LAB_0012764a:
    *puVar10 = uVar5;
    puVar10 = puVar10 + 1;
    length = length - uVar4;
  } while( true );
}

Assistant:

void Simple9<MarkLength, hacked>::encodeArray(const uint32_t *in,
                                              const size_t length,
                                              uint32_t *out, size_t &nvalue) {
  uint32_t NumberOfValuesCoded;
  const uint32_t *const initout(out);
  if (MarkLength)
    *(out++) = uint32_t(length);
  size_t ValuesRemaining(length);
  // precompute
  const bool becareful = false;

  while (ValuesRemaining >= 28) {
    if (hacked && trymefull<28, 0>(in)) {
      out[0] = 9 << (32 - SIMPLE9_LOGDESC);
      NumberOfValuesCoded = 28;
      in += 28;
    } else if (trymefull<28, 1>(in)) {
      out[0] = 0;
      NumberOfValuesCoded = 28;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 1);
      if (becareful)
        assert(which(out) == 0);
    } else if (trymefull<14, 2>(in)) {
      out[0] = 1;
      NumberOfValuesCoded = 14;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 2);
      if (becareful)
        assert(which(out) == 1);
    } else if (trymefull<9, 3>(in)) {
      out[0] = 2;
      NumberOfValuesCoded = 9;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 3);
      *out <<= 28 - 3 * 9;
      if (becareful)
        assert(which(out) == 2);
    } else if (trymefull<7, 4>(in)) {
      out[0] = 3;

      NumberOfValuesCoded = 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 4);
      if (becareful)
        assert(which(out) == 7);
    } else if (trymefull<5, 5>(in)) {
      out[0] = 4;

      NumberOfValuesCoded = 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 5);
      *out <<= 28 - 5 * 5;
      if (becareful)
        assert(which(out) == 4);
    } else if (trymefull<4, 7>(in)) {
      out[0] = 5;
      NumberOfValuesCoded = 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 7);

      if (becareful)
        assert(which(out) == 5);
    } else if (trymefull<3, 9>(in)) {
      out[0] = 6;
      NumberOfValuesCoded = 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 9);
      *out <<= 28 - 9 * 3;
      if (becareful)
        assert(which(out) == 6);
    } else if (trymefull<2, 14>(in)) {
      out[0] = 7;

      NumberOfValuesCoded = 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 14);

      if (becareful)
        assert(which(out) == 14);
    } else {
      if ((*in >> 28) > 0) {
        fprintf(stderr, "Input's out of range: %u\n", *in);
        throw std::runtime_error(
            "You tried to apply Simple9 to an incompatible set of integers.");
      }

      out[0] = 8;

      NumberOfValuesCoded = 1;
      bit_writer(out, *in++, 28);
      if (becareful)
        assert(which(out) == 15);
    }

    ++out;

    ValuesRemaining -= NumberOfValuesCoded;
  }
  while (ValuesRemaining > 0) {
    if (hacked && trymefull<28, 0>(in)) {
      out[0] = 9 << (32 - SIMPLE9_LOGDESC);
      NumberOfValuesCoded = (ValuesRemaining < 28) ? uint32_t(ValuesRemaining) : 28;
      in += NumberOfValuesCoded;
    } else if (tryme<28, 1>(in, ValuesRemaining)) {
      out[0] = 0;

      NumberOfValuesCoded = (ValuesRemaining < 28) ? uint32_t(ValuesRemaining) : 28;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 1);
      *out <<= 28 - NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 0);
    } else if (tryme<14, 2>(in, ValuesRemaining)) {
      out[0] = 1;

      NumberOfValuesCoded = (ValuesRemaining < 14) ? uint32_t(ValuesRemaining) : 14;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 2);
      *out <<= 28 - 2 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 1);
    } else if (tryme<9, 3>(in, ValuesRemaining)) {
      out[0] = 2;
      NumberOfValuesCoded = (ValuesRemaining < 9) ? uint32_t(ValuesRemaining) : 9;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 3);
      *out <<= 28 - 3 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 2);
    } else if (tryme<7, 4>(in, ValuesRemaining)) {
      out[0] = 3;

      NumberOfValuesCoded = (ValuesRemaining < 7) ? uint32_t(ValuesRemaining) : 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 4);
      *out <<= 28 - 4 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 7);
    } else if (tryme<5, 5>(in, ValuesRemaining)) {
      out[0] = 4;

      NumberOfValuesCoded = (ValuesRemaining < 5) ? uint32_t(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 5);
      *out <<= 28 - 5 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 4);
    } else if (tryme<4, 7>(in, ValuesRemaining)) {
      out[0] = 5;
      NumberOfValuesCoded = (ValuesRemaining < 4) ? uint32_t(ValuesRemaining) : 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 7);

      *out <<= 28 - 7 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 5);
    } else if (tryme<3, 9>(in, ValuesRemaining)) {
      out[0] = 6;
      NumberOfValuesCoded = (ValuesRemaining < 3) ? uint32_t(ValuesRemaining) : 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 9);
      *out <<= 28 - 9 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 6);
    } else if (tryme<2, 14>(in, ValuesRemaining)) {
      out[0] = 7;
      NumberOfValuesCoded = (ValuesRemaining < 2) ? uint32_t(ValuesRemaining) : 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out, *in++, 14);
      *out <<= 28 - 14 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out) == 14);
    } else {
      if ((*in >> 28) > 0) {
        fprintf(stderr, "Input's out of range: %u\n", *in);
        throw std::runtime_error(
            "You tried to apply Simple9 to an incompatible set of integers.");
      }
      out[0] = 8;
      NumberOfValuesCoded = 1;
      bit_writer(out, *in++, 28);
      if (becareful)
        assert(which(out) == 15);
    }
    ++out;
    ValuesRemaining -= NumberOfValuesCoded;
  }
  nvalue = out - initout;
}